

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

VkPipelineCreateFlags2KHR
Fossilize::normalize_pipeline_creation_flags(VkPipelineCreateFlags2KHR flags)

{
  VkPipelineCreateFlags2KHR flags_local;
  
  return flags & 0xffffffff7ffffc3f;
}

Assistant:

static VkPipelineCreateFlags2KHR normalize_pipeline_creation_flags(VkPipelineCreateFlags2KHR flags)
{
	// Remove flags which do not meaningfully contribute to compilation.
	flags &= ~VkPipelineCreateFlags2KHR(VK_PIPELINE_CREATE_CAPTURE_INTERNAL_REPRESENTATIONS_BIT_KHR |
	                                    VK_PIPELINE_CREATE_CAPTURE_STATISTICS_BIT_KHR |
	                                    VK_PIPELINE_CREATE_EARLY_RETURN_ON_FAILURE_BIT_EXT |
	                                    VK_PIPELINE_CREATE_FAIL_ON_PIPELINE_COMPILE_REQUIRED_BIT_EXT |
	                                    VK_PIPELINE_CREATE_2_CAPTURE_DATA_BIT_KHR);
	return flags;
}